

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber-unix.cpp
# Opt level: O3

void __thiscall cilk_fiber_sysdep::cilk_fiber_sysdep(cilk_fiber_sysdep *this,size_t stack_size)

{
  cilk_fiber::cilk_fiber(&this->super_cilk_fiber,stack_size);
  this->m_magic = 0x5afef00d;
  make_stack(this,stack_size);
  *(byte *)&this->m_stack_base = *(byte *)&this->m_stack_base & 0xe0;
  return;
}

Assistant:

cilk_fiber_sysdep::cilk_fiber_sysdep(std::size_t stack_size)
    : cilk_fiber(stack_size)
    , m_magic(magic_number)
{
    // Set m_stack and m_stack_base.
    make_stack(stack_size);

    // Get high-address of stack, with 32-bytes of spare space, and rounded
    // down to the nearest 32-byte boundary.
    const uintptr_t align_mask = 32 - 1;
    m_stack_base -= ((std::size_t) m_stack_base) & align_mask;
}